

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O2

void __thiscall PSEngine::PSEngine(PSEngine *this,Config p_config,shared_ptr<PSLogger> *p_logger)

{
  _Rb_tree_header *p_Var1;
  __shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2> local_50;
  undefined **local_40;
  undefined8 local_38;
  
  this->m_config = p_config;
  std::__shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>,
             &p_logger->super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>);
  CompiledGame::CompiledGame(&this->m_compiled_game);
  (this->m_current_level).level_idx = -1;
  (this->m_current_level).size.x = 0;
  (this->m_current_level).size.y = 0;
  this->m_last_input = None;
  (this->m_single_char_obj_alias_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_single_char_obj_alias_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->m_single_char_obj_alias_cache)._M_t._M_impl.super__Rb_tree_header;
  (this->m_current_level).cells.super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_current_level).cells.super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_current_level).cells.super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_level_state_stack).super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_level_state_stack).super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_level_state_stack).super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_operation_history).
  super__Vector_base<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_operation_history).
  super__Vector_base<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_operation_history).
  super__Vector_base<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_turn_history).subturns.
  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_turn_history).subturns.
  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_turn_history).subturns.
  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_turn_history).was_turn_cancelled = false;
  (this->m_single_char_obj_alias_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_single_char_obj_alias_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_single_char_obj_alias_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_is_level_won = false;
  this->m_current_tick_time_elapsed = 0.0;
  p_Var1 = &(this->m_object_cache).m_content._M_t._M_impl.super__Rb_tree_header;
  (this->m_object_cache).m_content._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_object_cache).m_content._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_object_cache).m_content._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_object_cache).m_content._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_object_cache).m_content._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::operator<<((ostream *)&std::cout,
                    "A Logger ptr was not passed to the engine constructor, construction a default one\n"
                   );
    local_40 = &PTR__PSLogger_0015cc28;
    local_38 = 3;
    std::make_shared<PSLogger,PSLogger>((PSLogger *)&local_50);
    std::__shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>,&local_50)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  return;
}

Assistant:

PSEngine::PSEngine(Config p_config, shared_ptr<PSLogger> p_logger /*=nullptr*/) : m_config(p_config), m_logger(p_logger)
{
    if(m_logger == nullptr)
	{
		cout << "A Logger ptr was not passed to the engine constructor, construction a default one\n";
		m_logger = make_shared<PSLogger>(PSLogger());
	}
}